

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics_collector.cc
# Opt level: O0

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *
prometheus::detail::CollectMetrics
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,
          vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
          *collectables)

{
  bool bVar1;
  element_type *peVar2;
  iterator iVar3;
  move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
  __last;
  __normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
  local_98;
  const_iterator local_90;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_78;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *local_60;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *metrics;
  undefined1 local_50 [8];
  shared_ptr<prometheus::Collectable> collectable;
  weak_ptr<prometheus::Collectable> *wcollectable;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *__range2;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *collectables_local;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *collected_metrics;
  
  memset(__return_storage_ptr__,0,0x18);
  std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
            (__return_storage_ptr__);
  __end2 = std::
           vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
           ::begin(collectables);
  wcollectable = (weak_ptr<prometheus::Collectable> *)
                 std::
                 vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
                 ::end(collectables);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
                                     *)&wcollectable), bVar1) {
    collectable.super___shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            __gnu_cxx::
            __normal_iterator<const_std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
            ::operator*(&__end2);
    std::weak_ptr<prometheus::Collectable>::lock((weak_ptr<prometheus::Collectable> *)local_50);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      (*peVar2->_vptr_Collectable[2])(&local_78);
      local_60 = &local_78;
      local_98._M_current =
           (MetricFamily *)
           std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<prometheus::MetricFamily_const*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>
      ::__normal_iterator<prometheus::MetricFamily*>
                ((__normal_iterator<prometheus::MetricFamily_const*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>
                  *)&local_90,&local_98);
      iVar3 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::
              begin(local_60);
      __first = std::
                make_move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>
                          ((__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
                            )iVar3._M_current);
      iVar3 = std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::end
                        (local_60);
      __last = std::
               make_move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>
                         ((__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>
                           )iVar3._M_current);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,local_90,__first,__last);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_78);
      metrics._4_4_ = 0;
    }
    else {
      metrics._4_4_ = 3;
    }
    std::shared_ptr<prometheus::Collectable>::~shared_ptr
              ((shared_ptr<prometheus::Collectable> *)local_50);
    __gnu_cxx::
    __normal_iterator<const_std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> CollectMetrics(
    const std::vector<std::weak_ptr<prometheus::Collectable>>& collectables) {
  auto collected_metrics = std::vector<MetricFamily>{};

  for (auto&& wcollectable : collectables) {
    auto collectable = wcollectable.lock();
    if (!collectable) {
      continue;
    }

    auto&& metrics = collectable->Collect();
    collected_metrics.insert(collected_metrics.end(),
                             std::make_move_iterator(metrics.begin()),
                             std::make_move_iterator(metrics.end()));
  }

  return collected_metrics;
}